

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_enc_vint(kstring_t *s,int n,int32_t *a,int wsize)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  size_t sVar11;
  
  if (n == 1) {
    bcf_enc_int1(s,*a);
    return;
  }
  if (n == 0) {
    sVar9 = s->l;
    uVar6 = sVar9 + 1;
    if (uVar6 < s->m) {
      pcVar7 = s->s;
    }
    else {
      uVar6 = uVar6 >> 1 | uVar6;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar6 = uVar6 >> 8 | uVar6;
      sVar11 = (uVar6 >> 0x10 | uVar6) + 1;
      s->m = sVar11;
      pcVar7 = (char *)realloc(s->s,sVar11);
      if (pcVar7 == (char *)0x0) {
        return;
      }
      s->s = pcVar7;
      sVar9 = s->l;
      uVar6 = sVar9 + 1;
    }
    s->l = uVar6;
    pcVar7[sVar9] = '\0';
    s->s[s->l] = '\0';
  }
  else {
    if (wsize < 1) {
      wsize = n;
    }
    if (n < 1) {
      iVar5 = 0x7fffffff;
      iVar10 = -0x7fffffff;
    }
    else {
      iVar10 = -0x7fffffff;
      iVar5 = 0x7fffffff;
      uVar6 = 0;
      do {
        iVar1 = a[uVar6];
        iVar3 = iVar1;
        if (iVar1 < iVar10) {
          iVar3 = iVar10;
        }
        iVar4 = iVar1;
        if (iVar5 < iVar1) {
          iVar4 = iVar5;
        }
        if (-0x7fffffff < iVar1) {
          iVar5 = iVar4;
          iVar10 = iVar3;
        }
        uVar6 = uVar6 + 1;
      } while ((uint)n != uVar6);
    }
    if (iVar5 < -0x7e || 0x7f < iVar10) {
      if (iVar5 < -0x7ffe || 0x7fff < iVar10) {
        bcf_enc_size(s,wsize,3);
        if (0 < n) {
          uVar6 = 0;
          do {
            iVar2 = a[uVar6];
            sVar9 = s->l;
            uVar8 = sVar9 + 5;
            if (uVar8 < s->m) {
              pcVar7 = s->s;
LAB_0011bdf7:
              *(int32_t *)(pcVar7 + sVar9) = iVar2;
              sVar9 = s->l;
              s->l = sVar9 + 4;
              s->s[sVar9 + 4] = '\0';
            }
            else {
              uVar8 = uVar8 >> 1 | uVar8;
              uVar8 = uVar8 >> 2 | uVar8;
              uVar8 = uVar8 >> 4 | uVar8;
              uVar8 = uVar8 >> 8 | uVar8;
              sVar11 = (uVar8 >> 0x10 | uVar8) + 1;
              s->m = sVar11;
              pcVar7 = (char *)realloc(s->s,sVar11);
              if (pcVar7 != (char *)0x0) {
                s->s = pcVar7;
                sVar9 = s->l;
                goto LAB_0011bdf7;
              }
            }
            uVar6 = uVar6 + 1;
          } while ((uint)n != uVar6);
        }
      }
      else {
        bcf_enc_size(s,wsize,2);
        if (0 < n) {
          uVar6 = 0;
          do {
            iVar10 = a[uVar6];
            if (iVar10 == -0x7fffffff) {
              iVar10 = 0x8001;
            }
            sVar9 = s->l;
            uVar8 = sVar9 + 3;
            if (uVar8 < s->m) {
              pcVar7 = s->s;
LAB_0011bd53:
              *(short *)(pcVar7 + sVar9) = (short)iVar10;
              sVar9 = s->l;
              s->l = sVar9 + 2;
              s->s[sVar9 + 2] = '\0';
            }
            else {
              uVar8 = uVar8 >> 1 | uVar8;
              uVar8 = uVar8 >> 2 | uVar8;
              uVar8 = uVar8 >> 4 | uVar8;
              uVar8 = uVar8 >> 8 | uVar8;
              sVar11 = (uVar8 >> 0x10 | uVar8) + 1;
              s->m = sVar11;
              pcVar7 = (char *)realloc(s->s,sVar11);
              if (pcVar7 != (char *)0x0) {
                s->s = pcVar7;
                sVar9 = s->l;
                goto LAB_0011bd53;
              }
            }
            uVar6 = uVar6 + 1;
          } while ((uint)n != uVar6);
        }
      }
    }
    else {
      bcf_enc_size(s,wsize,1);
      if (0 < n) {
        uVar6 = 0;
        do {
          iVar10 = a[uVar6];
          sVar9 = s->l;
          uVar8 = sVar9 + 1;
          if (iVar10 == -0x7fffffff) {
            if (uVar8 < s->m) {
              pcVar7 = s->s;
LAB_0011bbc5:
              s->l = uVar8;
              pcVar7[sVar9] = -0x7f;
              goto LAB_0011bc83;
            }
            uVar8 = uVar8 >> 1 | uVar8;
            uVar8 = uVar8 >> 2 | uVar8;
            uVar8 = uVar8 >> 4 | uVar8;
            uVar8 = uVar8 >> 8 | uVar8;
            sVar11 = (uVar8 >> 0x10 | uVar8) + 1;
            s->m = sVar11;
            pcVar7 = (char *)realloc(s->s,sVar11);
            if (pcVar7 != (char *)0x0) {
              s->s = pcVar7;
              sVar9 = s->l;
              uVar8 = sVar9 + 1;
              goto LAB_0011bbc5;
            }
          }
          else {
            if (uVar8 < s->m) {
              pcVar7 = s->s;
            }
            else {
              uVar8 = uVar8 >> 1 | uVar8;
              uVar8 = uVar8 >> 2 | uVar8;
              uVar8 = uVar8 >> 4 | uVar8;
              uVar8 = uVar8 >> 8 | uVar8;
              sVar11 = (uVar8 >> 0x10 | uVar8) + 1;
              s->m = sVar11;
              pcVar7 = (char *)realloc(s->s,sVar11);
              if (pcVar7 == (char *)0x0) goto LAB_0011bc8e;
              s->s = pcVar7;
              sVar9 = s->l;
              uVar8 = sVar9 + 1;
            }
            s->l = uVar8;
            pcVar7[sVar9] = (char)iVar10;
LAB_0011bc83:
            s->s[s->l] = '\0';
          }
LAB_0011bc8e:
          uVar6 = uVar6 + 1;
        } while ((uint)n != uVar6);
      }
    }
  }
  return;
}

Assistant:

void bcf_enc_vint(kstring_t *s, int n, int32_t *a, int wsize)
{
    int32_t max = INT32_MIN + 1, min = INT32_MAX;
    int i;
    if (n == 0) bcf_enc_size(s, 0, BCF_BT_NULL);
    else if (n == 1) bcf_enc_int1(s, a[0]);
    else {
        if (wsize <= 0) wsize = n;
        for (i = 0; i < n; ++i) {
            if (a[i] == bcf_int32_missing || a[i] == bcf_int32_vector_end ) continue;
            if (max < a[i]) max = a[i];
            if (min > a[i]) min = a[i];
        }
        if (max <= INT8_MAX && min > bcf_int8_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT8);
            for (i = 0; i < n; ++i)
                if ( a[i]==bcf_int32_vector_end ) kputc(bcf_int8_vector_end, s);
                else if ( a[i]==bcf_int32_missing ) kputc(bcf_int8_missing, s);
                else kputc(a[i], s);
        } else if (max <= INT16_MAX && min > bcf_int16_vector_end) {
            bcf_enc_size(s, wsize, BCF_BT_INT16);
            for (i = 0; i < n; ++i)
            {
                int16_t x;
                if ( a[i]==bcf_int32_vector_end ) x = bcf_int16_vector_end;
                else if ( a[i]==bcf_int32_missing ) x = bcf_int16_missing;
                else x = a[i];
                kputsn((char*)&x, 2, s);
            }
        } else {
            bcf_enc_size(s, wsize, BCF_BT_INT32);
            for (i = 0; i < n; ++i) {
                int32_t x = a[i];
                kputsn((char*)&x, 4, s);
            }
        }
    }
}